

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  char *pcVar1;
  int *in_RSI;
  IdList_item *pOldItem;
  IdList_item *pNewItem;
  int i;
  IdList *pNew;
  u64 in_stack_ffffffffffffffd0;
  IdList_item *z;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  IdList *local_8;
  
  if (in_RSI == (int *)0x0) {
    local_8 = (IdList *)0x0;
  }
  else {
    local_8 = (IdList *)
              sqlite3DbMallocRawNN
                        ((sqlite3 *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd0);
    if (local_8 == (IdList *)0x0) {
      local_8 = (IdList *)0x0;
    }
    else {
      local_8->nId = *in_RSI;
      for (iVar2 = 0; iVar2 < *in_RSI; iVar2 = iVar2 + 1) {
        z = local_8->a + iVar2;
        pcVar1 = sqlite3DbStrDup((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),(char *)z);
        z->zName = pcVar1;
      }
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, const IdList *p){
  IdList *pNew;
  int i;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sizeof(*pNew)+(p->nId-1)*sizeof(p->a[0]) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    const struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
  }
  return pNew;
}